

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<7UL> mserialize::cx_strcat<6ul,1ul>(cx_string<6UL> *strings,cx_string<1UL> *strings_1)

{
  char *pcVar1;
  cx_string<7UL> cVar2;
  size_t i;
  long lVar3;
  size_t s;
  ulong uVar4;
  char buffer [8];
  ulong auStack_48 [4];
  long lStack_28;
  cx_string<6UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<7UL> local_10;
  
  pcVar1 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_20 = strings;
  local_18 = strings_1;
  auStack_48[1] = 6;
  auStack_48[2] = 1;
  for (lVar3 = 1; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (uVar4 = 0; uVar4 < auStack_48[lVar3]; uVar4 = uVar4 + 1) {
      pcVar1[uVar4] = *(char *)((&lStack_28)[lVar3] + uVar4);
    }
    pcVar1 = pcVar1 + uVar4;
  }
  cx_string<7UL>::cx_string(&local_10,buffer);
  cVar2._data[0] = local_10._data[0];
  cVar2._data[1] = local_10._data[1];
  cVar2._data[2] = local_10._data[2];
  cVar2._data[3] = local_10._data[3];
  cVar2._data[4] = local_10._data[4];
  cVar2._data[5] = local_10._data[5];
  cVar2._data[6] = local_10._data[6];
  cVar2._data[7] = local_10._data[7];
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}